

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

ParseNodePtr __thiscall
Parser::ParseArgList<true>
          (Parser *this,bool *pCallOfConstants,uint16 *pSpreadArgCount,uint16 *pCount)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  tokens tVar4;
  undefined4 *puVar5;
  ParseNodePtr pPVar6;
  long lVar7;
  Parser *this_00;
  int iVar8;
  undefined1 local_78 [8];
  IdentToken token;
  ParseNode *local_50;
  ParseNodePtr pnodeList;
  ParseNodePtr *lastNodeRef;
  bool *local_38;
  
  local_50 = (ParseNodePtr)0x0;
  pnodeList = (ParseNodePtr)0x0;
  lastNodeRef = (ParseNodePtr *)pSpreadArgCount;
  local_38 = pCallOfConstants;
  if ((this->m_token).tk != tkLParen) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x10dc,"(m_token.tk == tkLParen)","m_token.tk == tkLParen");
    if (!bVar2) {
LAB_00e905cc:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  token._16_8_ = &this->m_scan;
  tVar4 = Scanner<UTF8EncodingPolicyBase<false>_>::Scan
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)token._16_8_);
  if (tVar4 == tkRParen) {
    return (ParseNodePtr)0x0;
  }
  *local_38 = true;
  *(undefined2 *)lastNodeRef = 0;
  iVar8 = -0xfff9;
  do {
    local_78._0_4_ = tkNone;
    token.tk = tkNone;
    token._4_4_ = 0;
    pPVar6 = ParseExpr<true>(this,1,(BOOL *)0x0,1,1,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,
                             (IdentToken *)local_78,false,(bool *)0x0,(charcount_t *)0x0,(bool *)0x0
                            );
    MarkEscapingRef(this,pPVar6,(IdentToken *)local_78);
    CheckArguments(this,pPVar6);
    OVar3 = pPVar6->nop;
    if (*local_38 == true) {
      if (OVar3 != knopFlt) {
        if (OVar3 == knopInt) {
          ParseNode::AsParseNodeInt(pPVar6);
          OVar3 = pPVar6->nop;
        }
        else {
          *local_38 = false;
        }
        goto LAB_00e90474;
      }
    }
    else {
LAB_00e90474:
      if (OVar3 == knopEllipsis) {
        *(short *)lastNodeRef = *(short *)lastNodeRef + 1;
      }
    }
    AddToNodeList(this,&local_50,(ParseNode ***)&pnodeList,pPVar6);
    pPVar6->field_0x1 = pPVar6->field_0x1 | 2;
    if (((this->m_token).tk != tkComma) ||
       ((this_00 = (Parser *)token._16_8_,
        Scanner<UTF8EncodingPolicyBase<false>_>::Scan
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)token._16_8_),
        (this->m_token).tk == tkRParen &&
        (((this->m_scriptContext->config).threadConfig)->m_ES7TrailingComma != false)))) {
      pPVar6 = pnodeList;
      *pCount = (short)iVar8 - 6;
      if (pnodeList == (ParseNodePtr)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x1116,"(lastNodeRef)","lastNodeRef");
        if (!bVar2) goto LAB_00e905cc;
        *puVar5 = 0;
      }
      lVar7._0_1_ = pPVar6->nop;
      lVar7._1_1_ = pPVar6->field_0x1;
      lVar7._2_2_ = pPVar6->grfpn;
      lVar7._4_4_ = pPVar6->ichMin;
      if (lVar7 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x1117,"(*lastNodeRef)","*lastNodeRef");
        if (!bVar2) goto LAB_00e905cc;
        *puVar5 = 0;
        lVar7._0_1_ = pPVar6->nop;
        lVar7._1_1_ = pPVar6->field_0x1;
        lVar7._2_2_ = pPVar6->grfpn;
        lVar7._4_4_ = pPVar6->ichMin;
      }
      local_50->ichLim = *(charcount_t *)(lVar7 + 8);
      return local_50;
    }
    iVar8 = iVar8 + 1;
    if (iVar8 == 0) {
      Error(this_00,-0x7ff5fbfb,L"",L"");
    }
  } while( true );
}

Assistant:

ParseNodePtr Parser::ParseArgList(bool *pCallOfConstants, uint16 *pSpreadArgCount, uint16 * pCount)
{
    ParseNodePtr pnodeArg;
    ParseNodePtr pnodeList = nullptr;
    ParseNodePtr *lastNodeRef = nullptr;

    // Check for an empty list
    Assert(m_token.tk == tkLParen);

    if (this->GetScanner()->Scan() == tkRParen)
    {
        return nullptr;
    }

    *pCallOfConstants = true;
    *pSpreadArgCount = 0;

    int count = 0;
    while (true)
    {
        if (count >= Js::Constants::MaxAllowedArgs)
        {
            Error(ERRTooManyArgs);
        }
        // Allow spread in argument lists.
        IdentToken token;
        pnodeArg = ParseExpr<buildAST>(koplCma, nullptr, TRUE, /* fAllowEllipsis */TRUE, NULL, nullptr, nullptr, &token);
        ++count;
        this->MarkEscapingRef(pnodeArg, &token);

        if (buildAST)
        {
            this->CheckArguments(pnodeArg);

            if (*pCallOfConstants && !IsConstantInFunctionCall(pnodeArg))
            {
                *pCallOfConstants = false;
            }

            if (pnodeArg->nop == knopEllipsis)
            {
                (*pSpreadArgCount)++;
            }

            AddToNodeListEscapedUse(&pnodeList, &lastNodeRef, pnodeArg);
        }
        if (m_token.tk != tkComma)
        {
            break;
        }
        this->GetScanner()->Scan();

        if (m_token.tk == tkRParen && m_scriptContext->GetConfig()->IsES7TrailingCommaEnabled())
        {
            break;
        }
    }

    if (pSpreadArgCount != nullptr && (*pSpreadArgCount) > 0) {
        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, SpreadFeature, m_scriptContext);
    }

    *pCount = static_cast<uint16>(count);
    if (buildAST)
    {
        Assert(lastNodeRef);
        Assert(*lastNodeRef);
        pnodeList->ichLim = (*lastNodeRef)->ichLim;
    }

    return pnodeList;
}